

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__out_gif_code(stbi__gif *g,stbi__uint16 code)

{
  stbi__uint16 code_00;
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  
  uVar7 = CONCAT62(in_register_00000032,code) & 0xffffffff;
  code_00 = g->codes[uVar7].prefix;
  if (-1 < (short)code_00) {
    stbi__out_gif_code(g,code_00);
  }
  if (g->cur_y < g->max_y) {
    lVar4 = (long)g->cur_x + (long)g->cur_y;
    psVar1 = g->out;
    iVar3 = (int)lVar4;
    iVar6 = iVar3 + 3;
    if (-1 < iVar3) {
      iVar6 = iVar3;
    }
    g->history[iVar6 >> 2] = '\x01';
    psVar2 = g->color_table;
    uVar7 = (ulong)g->codes[uVar7].suffix;
    if (0x80 < psVar2[uVar7 * 4 + 3]) {
      psVar1[lVar4] = psVar2[uVar7 * 4 + 2];
      psVar1[lVar4 + 1] = psVar2[uVar7 * 4 + 1];
      psVar1[lVar4 + 2] = psVar2[uVar7 * 4];
      psVar1[lVar4 + 3] = psVar2[uVar7 * 4 + 3];
    }
    iVar3 = g->cur_x + 4;
    g->cur_x = iVar3;
    if (g->max_x <= iVar3) {
      g->cur_x = g->start_x;
      iVar3 = g->cur_y + g->step;
      g->cur_y = iVar3;
      if (g->max_y <= iVar3) {
        uVar5 = g->parse;
        do {
          if ((int)uVar5 < 1) {
            return;
          }
          iVar3 = g->line_size << (uVar5 & 0x1f);
          uVar5 = uVar5 - 1;
          g->step = iVar3;
          iVar3 = (iVar3 >> 1) + g->start_y;
          g->cur_y = iVar3;
          g->parse = uVar5;
        } while (g->max_y <= iVar3);
      }
    }
  }
  return;
}

Assistant:

static void stbi__out_gif_code(stbi__gif *g, stbi__uint16 code)
{
   stbi_uc *p, *c;
   int idx;

   // recurse to decode the prefixes, since the linked-list is backwards,
   // and working backwards through an interleaved image would be nasty
   if (g->codes[code].prefix >= 0)
      stbi__out_gif_code(g, g->codes[code].prefix);

   if (g->cur_y >= g->max_y) return;

   idx = g->cur_x + g->cur_y;
   p = &g->out[idx];
   g->history[idx / 4] = 1;

   c = &g->color_table[g->codes[code].suffix * 4];
   if (c[3] > 128) { // don't render transparent pixels;
      p[0] = c[2];
      p[1] = c[1];
      p[2] = c[0];
      p[3] = c[3];
   }
   g->cur_x += 4;

   if (g->cur_x >= g->max_x) {
      g->cur_x = g->start_x;
      g->cur_y += g->step;

      while (g->cur_y >= g->max_y && g->parse > 0) {
         g->step = (1 << g->parse) * g->line_size;
         g->cur_y = g->start_y + (g->step >> 1);
         --g->parse;
      }
   }
}